

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

void __thiscall
BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff(BayesianGameIdenticalPayoff *this)

{
  ostream *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__BayesianGameIdenticalPayoff_00d06650;
  if (in_RDI[0x1c] == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff() trying to delete this BG twice!"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    if ((long *)in_RDI[0x1c] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0x1c] + 0x18))();
    }
    in_RDI[0x1c] = 0;
  }
  BayesianGameIdenticalPayoffInterface::~BayesianGameIdenticalPayoffInterface
            ((BayesianGameIdenticalPayoffInterface *)0x8ae478);
  return;
}

Assistant:

BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff()
{
    if (_m_utilFunction != 0)
    {
        delete _m_utilFunction;
        _m_utilFunction = 0;
    }
    else
        cerr << "BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff() trying to delete this BG twice!" << endl;
}